

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

bool __thiscall
cornerstone::raft_server::handle_snapshot_sync_req(raft_server *this,snapshot_sync_req *req)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  snapshot *psVar4;
  ulong uVar5;
  buffer *pbVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *__s;
  snapshot_sync_req *in_RSI;
  long in_RDI;
  ptr<cluster_config> *in_stack_000003c8;
  raft_server *in_stack_000003d0;
  shared_ptr<cornerstone::snapshot> *in_stack_fffffffffffffd38;
  __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffd40;
  shared_ptr<cornerstone::cluster_config> *in_stack_fffffffffffffd48;
  unsigned_long *in_stack_fffffffffffffd50;
  unsigned_long *in_stack_fffffffffffffd58;
  raft_server *in_stack_fffffffffffffd60;
  allocator<char> *in_stack_fffffffffffffd70;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd78;
  raft_server *in_stack_fffffffffffffd80;
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [32];
  char *local_f0;
  ulong local_e8;
  ulong local_e0;
  allocator<char> local_d8 [23];
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [39];
  allocator<char> local_49;
  string local_48 [48];
  snapshot_sync_req *local_18;
  
  local_18 = in_RSI;
  peVar3 = std::
           __shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d8ff3);
  psVar4 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1d9008);
  uVar5 = snapshot_sync_req::get_offset(local_18);
  pbVar6 = snapshot_sync_req::get_data((snapshot_sync_req *)0x1d9036);
  (*peVar3->_vptr_state_machine[5])(peVar3,psVar4,uVar5,pbVar6);
  bVar1 = snapshot_sync_req::is_done(local_18);
  if (bVar1) {
    if (*(int *)(in_RDI + 0x128) != 1) {
      peVar7 = std::
               __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d90ba);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      (*peVar7->_vptr_logger[5])(peVar7,local_48);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator(&local_49);
      std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
                ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
                 0x1d913b);
      peVar8 = std::
               __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d9143);
      (*peVar8->_vptr_state_mgr[8])(peVar8,0xffffffff);
      exit(-1);
    }
    peVar7 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d91d6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    (*peVar7->_vptr_logger[2])(peVar7,local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    peVar9 = std::
             __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d925a);
    psVar4 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1d926f);
    uVar5 = snapshot::get_last_log_idx(psVar4);
    uVar2 = (*peVar9->_vptr_log_store[0xc])(peVar9,uVar5);
    if ((uVar2 & 1) == 0) {
      peVar7 = std::
               __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d988a);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      (*peVar7->_vptr_logger[5])(peVar7,local_138);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator(&local_139);
      return false;
    }
    stop_election_timer(in_stack_fffffffffffffd80);
    peVar7 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d92e5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    (*peVar7->_vptr_logger[3])(peVar7,local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    peVar3 = std::
             __shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d9369);
    psVar4 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1d937e);
    uVar2 = (*peVar3->_vptr_state_machine[6])(peVar3,psVar4);
    if ((uVar2 & 1) == 0) {
      peVar7 = std::
               __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d93cf);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      (*peVar7->_vptr_logger[3])(peVar7,local_c0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
      std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
                ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
                 0x1d9450);
      peVar8 = std::
               __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d9458);
      (*peVar8->_vptr_state_mgr[8])(peVar8,0xffffffff);
      exit(-1);
    }
    psVar4 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1d955d);
    snapshot::get_last_config(psVar4);
    reconfigure(in_stack_000003d0,in_stack_000003c8);
    std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
              ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
               0x1d95a6);
    peVar8 = std::
             __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d95ae);
    peVar10 = std::
              __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffd40);
    (*peVar8->_vptr_state_mgr[3])(peVar8,peVar10);
    psVar4 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1d95ed);
    uVar5 = snapshot::get_last_log_idx(psVar4);
    *(ulong *)(in_RDI + 0x20) = uVar5;
    psVar4 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1d962f);
    uVar5 = snapshot::get_last_log_idx(psVar4);
    *(ulong *)(in_RDI + 0x18) = uVar5;
    std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
              ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
               0x1d966d);
    peVar8 = std::
             __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d9675);
    peVar11 = std::
              __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*(in_stack_fffffffffffffd40);
    (*peVar8->_vptr_state_mgr[4])(peVar8,peVar11);
    psVar4 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1d96ae);
    local_e0 = snapshot::get_last_log_idx(psVar4);
    psVar4 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1d96e0);
    local_e8 = snapshot::get_last_log_term(psVar4);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 400);
    psVar4 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1d9725);
    __s = (char *)snapshot::size(psVar4);
    local_f0 = __s;
    cs_new<cornerstone::snapshot,unsigned_long,unsigned_long,std::shared_ptr<cornerstone::cluster_config>&,unsigned_long>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (unsigned_long *)in_stack_fffffffffffffd40);
    __a = local_d8;
    std::shared_ptr<cornerstone::snapshot>::operator=
              ((shared_ptr<cornerstone::snapshot> *)in_stack_fffffffffffffd40,
               in_stack_fffffffffffffd38);
    std::shared_ptr<cornerstone::snapshot>::~shared_ptr
              ((shared_ptr<cornerstone::snapshot> *)0x1d97a1);
    restart_election_timer(in_stack_fffffffffffffd60);
    peVar7 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d97c4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
    (*peVar7->_vptr_logger[3])(peVar7,local_110);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  return true;
}

Assistant:

bool raft_server::handle_snapshot_sync_req(snapshot_sync_req& req)
{
    try
    {
        state_machine_->save_snapshot_data(req.get_snapshot(), req.get_offset(), req.get_data());
        if (req.is_done())
        {
            // Only follower will run this piece of code, but let's check it again
            if (role_ != srv_role::follower)
            {
                l_->err("bad server role for applying a snapshot, exit for debugging");
                ctx_->state_mgr_->system_exit(-1);
                ::exit(-1);
            }

            l_->debug("sucessfully receive a snapshot from leader");
            if (log_store_->compact(req.get_snapshot().get_last_log_idx()))
            {
                // The state machine will not be able to commit anything before the snapshot is applied, so make this
                // synchronously with election timer stopped as usually applying a snapshot may take a very long time
                stop_election_timer();
                l_->info("successfully compact the log store, will now ask the statemachine to apply the snapshot");
                if (!state_machine_->apply_snapshot(req.get_snapshot()))
                {
                    l_->info("failed to apply the snapshot after log compacted, to ensure the safety, will shutdown "
                             "the system");
                    ctx_->state_mgr_->system_exit(-1);
                    ::exit(-1);
                    return false;
                }

                reconfigure(req.get_snapshot().get_last_config());
                ctx_->state_mgr_->save_config(*config_);
                sm_commit_index_ = req.get_snapshot().get_last_log_idx();
                quick_commit_idx_ = req.get_snapshot().get_last_log_idx();
                ctx_->state_mgr_->save_state(*state_);
                last_snapshot_ = cs_new<snapshot>(
                    req.get_snapshot().get_last_log_idx(),
                    req.get_snapshot().get_last_log_term(),
                    config_,
                    req.get_snapshot().size());
                restart_election_timer();
                l_->info("snapshot is successfully applied");
            }
            else
            {
                l_->err("failed to compact the log store after a snapshot is received, will ask the leader to retry");
                return false;
            }
        }
    }
    catch (...)
    {
        l_->err("failed to handle snapshot installation due to system errors");
        ctx_->state_mgr_->system_exit(-1);
        ::exit(-1);
        return false;
    }

    return true;
}